

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::anon_unknown_12::doParseModule
          (Result<wasm::Ok> *__return_storage_ptr__,Module *wasm,Lexer *input,bool allowExtra)

{
  ParseDeclsCtx *this;
  Err *pEVar1;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  *puVar2;
  bool bVar3;
  Ok local_521;
  Err local_520;
  Err *local_500;
  Err *err_5;
  Result<wasm::Ok> _val_5;
  Err *err_4;
  Result<wasm::Ok> _val_4;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
  implicitTypes;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
  typeNames;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  Err *err_1;
  Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
  _val_1;
  Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
  typeIndices;
  string local_2a8;
  Err local_288;
  uint local_264;
  Err local_260;
  Err *local_240;
  Err *err;
  undefined1 local_228 [8];
  Result<wasm::Ok> _val;
  ParseDeclsCtx decls;
  bool allowExtra_local;
  Lexer *input_local;
  Module *wasm_local;
  
  this = (ParseDeclsCtx *)
         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  decls._471_1_ = allowExtra;
  ParseDeclsCtx::ParseDeclsCtx(this,input,wasm);
  parseDecls((Result<wasm::Ok> *)local_228,this);
  local_240 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_228);
  bVar3 = local_240 != (Err *)0x0;
  if (bVar3) {
    wasm::Err::Err(&local_260,local_240);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_260);
    wasm::Err::~Err(&local_260);
  }
  local_264 = (uint)bVar3;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_228);
  if (local_264 == 0) {
    if (((decls._471_1_ & 1) != 0) ||
       (bVar3 = Lexer::empty((Lexer *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20)),
       bVar3)) {
      createIndexMap((Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                      *)((long)&_val_1.val.
                                super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                        + 0x38),
                     (Lexer *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                     (vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_> *)
                     &decls.recTypeDefs.
                      super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
      ::Result((Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                *)&err_1,
               (Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                *)((long)&_val_1.val.
                          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                  + 0x38));
      pEVar1 = Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
               ::getErr((Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                         *)&err_1);
      if (pEVar1 != (Err *)0x0) {
        wasm::Err::Err((Err *)&types.
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,pEVar1);
        Result<wasm::Ok>::Result
                  (__return_storage_ptr__,
                   (Err *)&types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        wasm::Err::~Err((Err *)&types.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      local_264 = (uint)(pEVar1 != (Err *)0x0);
      Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
      ::~Result((Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                 *)&err_1);
      if (local_264 == 0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   &typeNames._M_h._M_single_bucket);
        std::
        unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
        ::unordered_map((unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                         *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        puVar2 = Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                 ::operator*((Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                              *)((long)&_val_1.val.
                                        super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                        .
                                        super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                + 0x38));
        parseTypeDefs((Result<wasm::Ok> *)&err_2,
                      (ParseDeclsCtx *)
                      ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),input,puVar2,
                      (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                      &typeNames._M_h._M_single_bucket,
                      (unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                       *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        pEVar1 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
        if (pEVar1 != (Err *)0x0) {
          wasm::Err::Err((Err *)&implicitTypes._M_h._M_single_bucket,pEVar1);
          Result<wasm::Ok>::Result
                    (__return_storage_ptr__,(Err *)&implicitTypes._M_h._M_single_bucket);
          wasm::Err::~Err((Err *)&implicitTypes._M_h._M_single_bucket);
        }
        local_264 = (uint)(pEVar1 != (Err *)0x0);
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
        if (local_264 == 0) {
          std::
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          ::unordered_map((unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                           *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          puVar2 = Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                   ::operator*((Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                                *)((long)&_val_1.val.
                                          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                          .
                                          super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                  + 0x38));
          parseImplicitTypeDefs
                    ((Result<wasm::Ok> *)&err_3,
                     (ParseDeclsCtx *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),input,puVar2,
                     (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &typeNames._M_h._M_single_bucket,
                     (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                      *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          pEVar1 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
          if (pEVar1 != (Err *)0x0) {
            wasm::Err::Err((Err *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar1
                          );
            Result<wasm::Ok>::Result
                      (__return_storage_ptr__,
                       (Err *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            wasm::Err::~Err((Err *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          }
          local_264 = (uint)(pEVar1 != (Err *)0x0);
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
          if (local_264 == 0) {
            puVar2 = Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                     ::operator*((Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                                  *)((long)&_val_1.val.
                                            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                            .
                                            super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    + 0x38));
            parseModuleTypes((Result<wasm::Ok> *)&err_4,
                             (ParseDeclsCtx *)
                             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),input,
                             puVar2,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                    &typeNames._M_h._M_single_bucket,
                             (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                              *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            pEVar1 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_4);
            if (pEVar1 != (Err *)0x0) {
              wasm::Err::Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                             pEVar1);
              Result<wasm::Ok>::Result
                        (__return_storage_ptr__,
                         (Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              wasm::Err::~Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            local_264 = (uint)(pEVar1 != (Err *)0x0);
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_4);
            if (local_264 == 0) {
              puVar2 = Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                       ::operator*((Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                                    *)((long)&_val_1.val.
                                              super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                              .
                                              super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                      + 0x38));
              parseDefinitions((Result<wasm::Ok> *)&err_5,
                               (ParseDeclsCtx *)
                               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),input,
                               puVar2,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                      &typeNames._M_h._M_single_bucket,
                               (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                                *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                               (unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                                *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              local_500 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_5);
              bVar3 = local_500 != (Err *)0x0;
              if (bVar3) {
                wasm::Err::Err(&local_520,local_500);
                Result<wasm::Ok>::Result(__return_storage_ptr__,&local_520);
                wasm::Err::~Err(&local_520);
              }
              local_264 = (uint)bVar3;
              Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_5);
              if (local_264 == 0) {
                propagateDebugLocations(wasm);
                Lexer::operator=(input,(Lexer *)((long)&_val.val.
                                                  super__Variant_base<wasm::Ok,_wasm::Err>.
                                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20
                                                ));
                Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_521);
                local_264 = 1;
              }
            }
          }
          std::
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          ::~unordered_map((unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                            *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        std::
        unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
        ::~unordered_map((unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                          *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   &typeNames._M_h._M_single_bucket);
      }
      Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
      ::~Result((Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
                 *)((long)&_val_1.val.
                           super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                   + 0x38));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"Unexpected tokens after module",
                 (allocator<char> *)
                 ((long)&typeIndices.val.
                         super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                 + 0x3f));
      Lexer::err(&local_288,
                 (Lexer *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&local_2a8);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_288);
      wasm::Err::~Err(&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&typeIndices.val.
                         super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                 + 0x3f));
      local_264 = 1;
    }
  }
  ParseDeclsCtx::~ParseDeclsCtx
            ((ParseDeclsCtx *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> doParseModule(Module& wasm, Lexer& input, bool allowExtra) {
  ParseDeclsCtx decls(input, wasm);
  CHECK_ERR(parseDecls(decls));
  if (!allowExtra && !decls.in.empty()) {
    return decls.in.err("Unexpected tokens after module");
  }

  auto typeIndices = createIndexMap(decls.in, decls.typeDefs);
  CHECK_ERR(typeIndices);

  std::vector<HeapType> types;
  std::unordered_map<HeapType, std::unordered_map<Name, Index>> typeNames;
  CHECK_ERR(parseTypeDefs(decls, input, *typeIndices, types, typeNames));

  std::unordered_map<Index, HeapType> implicitTypes;
  CHECK_ERR(
    parseImplicitTypeDefs(decls, input, *typeIndices, types, implicitTypes));

  CHECK_ERR(parseModuleTypes(decls, input, *typeIndices, types, implicitTypes));

  CHECK_ERR(parseDefinitions(
    decls, input, *typeIndices, types, implicitTypes, typeNames));

  propagateDebugLocations(wasm);
  input = decls.in;

  return Ok{};
}